

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O2

void round_digit(char *digits,int ndigits,uint64_t delta,uint64_t rem,uint64_t kappa,uint64_t frac)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = delta - rem;
  uVar2 = frac - rem;
  for (; ((rem < frac && (bVar3 = kappa <= uVar1, uVar1 = uVar1 - kappa, bVar3)) &&
         ((rem + kappa < frac || (rem + (kappa - frac) < uVar2)))); uVar2 = uVar2 - kappa) {
    digits[(long)ndigits + -1] = digits[(long)ndigits + -1] + -1;
    rem = rem + kappa;
  }
  return;
}

Assistant:

static void round_digit(char* digits, int ndigits, uint64_t delta, uint64_t rem,
                        uint64_t kappa, uint64_t frac) {
  while (rem < frac && delta - rem >= kappa &&
         (rem + kappa < frac || frac - rem > rem + kappa - frac)) {
    digits[ndigits - 1]--;
    rem += kappa;
  }
}